

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::ColumnData::GetStatistics(ColumnData *this)

{
  int iVar1;
  InternalException *this_00;
  long in_RSI;
  string local_40;
  
  if (*(long *)(in_RSI + 0xf0) == 0) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"ColumnData::GetStatistics called on a column without stats","");
    InternalException::InternalException(this_00,&local_40);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 200));
  if (iVar1 == 0) {
    unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>,_true>::
    operator->((unique_ptr<duckdb::SegmentStatistics,_std::default_delete<duckdb::SegmentStatistics>,_true>
                *)(in_RSI + 0xf0));
    BaseStatistics::ToUnique((BaseStatistics *)this);
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 200));
    return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
           (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
  }
  ::std::__throw_system_error(iVar1);
}

Assistant:

void ColumnData::MergeStatistics(const BaseStatistics &other) {
	if (!stats) {
		throw InternalException("ColumnData::MergeStatistics called on a column without stats");
	}
	lock_guard<mutex> l(stats_lock);
	return stats->statistics.Merge(other);
}